

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libxml_reporter_tests.c
# Opt level: O0

char * failure_message_xmlNode_has_attribute_equal_to
                 (Constraint *constraint,char *actual_string,intptr_t actual_value)

{
  undefined8 *puVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  xmlChar *pxVar5;
  size_t sVar6;
  size_t sVar7;
  size_t sVar8;
  char *in_RSI;
  long in_RDI;
  char *message;
  size_t msglen;
  char *message_template;
  xmlChar *actualValue;
  xmlNode_has_attribute_equal_to *expected;
  xmlChar *in_stack_ffffffffffffff80;
  xmlNodePtr in_stack_ffffffffffffff88;
  char *local_8;
  
  puVar1 = *(undefined8 **)(in_RDI + 0x48);
  pxVar5 = getAttribute(in_stack_ffffffffffffff88,in_stack_ffffffffffffff80);
  iVar2 = xmlStrlen(*puVar1);
  sVar6 = strlen(in_RSI);
  sVar7 = strlen(*(char **)(in_RDI + 0x58));
  iVar3 = xmlStrlen(pxVar5);
  iVar4 = xmlStrlen(puVar1[1]);
  sVar8 = strlen(
                "Expected attribute [%s] of [%s] to [equal] [%s]\n\tactual value:\t\t[%s]\n\texpected to equal:\t[%s]\n"
                );
  sVar8 = (long)iVar2 + sVar6 + sVar7 + (long)iVar3 + (long)iVar4 + sVar8;
  local_8 = (char *)malloc(sVar8);
  if (local_8 == (char *)0x0) {
    (*_xmlFree)(pxVar5);
    local_8 = (char *)0x0;
  }
  else {
    iVar2 = snprintf(local_8,sVar8,
                     "Expected attribute [%s] of [%s] to [equal] [%s]\n\tactual value:\t\t[%s]\n\texpected to equal:\t[%s]\n"
                     ,*puVar1,in_RSI,*(undefined8 *)(in_RDI + 0x58),pxVar5,puVar1[1]);
    if ((long)iVar2 < (long)sVar8) {
      (*_xmlFree)(pxVar5);
    }
    else {
      (*_xmlFree)(pxVar5);
      free(local_8);
      local_8 = (char *)0x0;
    }
  }
  return local_8;
}

Assistant:

static char *failure_message_xmlNode_has_attribute_equal_to(
    Constraint *constraint, const char *actual_string, intptr_t actual_value) {
    struct xmlNode_has_attribute_equal_to *expected =
        (struct xmlNode_has_attribute_equal_to*)constraint->expected_value.value.pointer_value;
    xmlChar* actualValue = getAttribute((xmlNodePtr)actual_value, expected->attr);

    const char *message_template = "Expected attribute [%s] of [%s] to [equal] [%s]\n"
        "\tactual value:\t\t[%s]\n"
        "\texpected to equal:\t[%s]\n";
    size_t msglen = xmlStrlen(expected->attr) + strlen(actual_string) +
        strlen(constraint->expected_value_name) + xmlStrlen(actualValue) +
        xmlStrlen(expected->value) + strlen(message_template);
    char *message = (char*)malloc(msglen);
    if (!message) {
        xmlFree(actualValue);
        return NULL;
    }

    if (snprintf(message, msglen, message_template,
                 expected->attr, actual_string, constraint->expected_value_name,
                 actualValue, expected->value) >= (ssize_t)msglen) {
        xmlFree(actualValue);
        free(message);
        return NULL;
    }

    xmlFree(actualValue);
    return message;
}